

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool mjs::is_strict_mode_directive(expression *e)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  wstring *__lhs;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_18;
  
  bVar2 = is_directive(e);
  if (bVar2) {
    uVar1 = (e->super_syntax_node).extend_.start;
    local_18._M_str =
         (((e->super_syntax_node).extend_.file.
           super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->text_).
         _M_dataplus._M_p + uVar1;
    local_18._M_len = (size_t)((e->super_syntax_node).extend_.end - uVar1);
    iVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_18,1,10,L"use strict");
    if (iVar3 == 0) {
      __lhs = token::text_abi_cxx11_((token *)(e + 1));
      bVar2 = std::operator==(__lhs,L"use strict");
      if (bVar2) {
        return true;
      }
      __assert_fail("le.t().text() == strict_directive",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                    ,0xc1,"bool mjs::is_strict_mode_directive(const expression &)");
    }
  }
  return false;
}

Assistant:

bool is_strict_mode_directive(const expression& e) {
    if (!is_directive(e)) {
        return false;
    }
    const auto& le = static_cast<const literal_expression&>(e);
    // Check spelling of directive, "A Use Strict Directive may not contain an EscapeSequence or LineContinuation."
    if (le.extend().source_view().compare(1, sizeof(strict_directive)/sizeof(*strict_directive) -1, strict_directive) != 0) {
        return false;
    }
    assert(le.t().text() == strict_directive);
    return true;
}